

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwhash.h
# Opt level: O0

int hydro_pwhash_reencrypt(uint8_t *stored,uint8_t *master_key,uint8_t *new_master_key)

{
  uint8_t *in_RSI;
  char *in_RDI;
  undefined1 auVar1 [64];
  uint8_t *params;
  uint8_t *secretbox;
  uint8_t *enc_alg;
  uint8_t *in_stack_00000040;
  char *in_stack_00000048;
  uint64_t in_stack_00000050;
  size_t in_stack_00000058;
  uint8_t *in_stack_00000060;
  void *in_stack_00000068;
  char *ctx;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (*in_RDI == '\x01') {
    ctx = in_RDI;
    iVar2 = hydro_secretbox_decrypt
                      (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                       in_stack_00000048,in_stack_00000040);
    if (iVar2 == 0) {
      auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 1));
      *(undefined2 *)(in_RDI + 0x65) = *(undefined2 *)(in_RDI + 0x41);
      auVar1 = vmovdqu64_avx512f(auVar1);
      *(undefined1 (*) [64])(in_RDI + 0x25) = auVar1;
      iVar2 = hydro_secretbox_encrypt
                        (enc_alg,secretbox,(size_t)params,
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),ctx,in_RSI);
    }
    else {
      iVar2 = -1;
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
hydro_pwhash_reencrypt(uint8_t       stored[hydro_pwhash_STOREDBYTES],
                       const uint8_t master_key[hydro_pwhash_MASTERKEYBYTES],
                       const uint8_t new_master_key[hydro_pwhash_MASTERKEYBYTES])
{
    uint8_t *const enc_alg   = &stored[0];
    uint8_t *const secretbox = &enc_alg[hydro_pwhash_ENC_ALGBYTES];
    uint8_t *const params    = &secretbox[hydro_secretbox_HEADERBYTES];

    if (*enc_alg != hydro_pwhash_ENC_ALG) {
        return -1;
    }
    if (hydro_secretbox_decrypt(secretbox, secretbox,
                                hydro_secretbox_HEADERBYTES + hydro_pwhash_PARAMSBYTES,
                                (uint64_t) *enc_alg, hydro_pwhash_CONTEXT, master_key) != 0) {
        return -1;
    }
    memmove(params, secretbox, hydro_pwhash_PARAMSBYTES);
    return hydro_secretbox_encrypt(secretbox, params, hydro_pwhash_PARAMSBYTES, (uint64_t) *enc_alg,
                                   hydro_pwhash_CONTEXT, new_master_key);
}